

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UInt32Math.h
# Opt level: O0

uint32 UInt32Math::Mul<Math::RecordOverflowPolicy>
                 (uint32 lhs,uint32 rhs,RecordOverflowPolicy *overflowFn)

{
  uint64 result;
  RecordOverflowPolicy *overflowFn_local;
  uint32 rhs_local;
  uint32 lhs_local;
  
  if (0xffffffff < (ulong)lhs * (ulong)rhs) {
    Math::RecordOverflowPolicy::operator()(overflowFn);
  }
  return (uint32)((ulong)lhs * (ulong)rhs);
}

Assistant:

static uint32 Mul(uint32 lhs, uint32 rhs, __inout Func& overflowFn)
    {
        // Do the multiplication using 64-bit unsigned math.
        uint64 result = static_cast<uint64>(lhs) * static_cast<uint64>(rhs);

        // Does the result fit in 32-bits?
        if(result >= (1ui64 << 32))
        {
            overflowFn();
        }

        return static_cast<uint32>(result);
    }